

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_(void)

{
  string *in_RDI;
  string local_30;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmsys::SystemTools::CollapseFullPath(in_RDI,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string cmSystemTools::GetCurrentWorkingDirectory()
{
  return cmSystemTools::CollapseFullPath(
    cmsys::SystemTools::GetCurrentWorkingDirectory());
}